

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestSpecParser * __thiscall Catch::TestSpecParser::parse(TestSpecParser *this,string *arg)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *arg_local;
  TestSpecParser *this_local;
  
  this->m_mode = None;
  this->m_exclusion = false;
  local_18 = arg;
  arg_local = (string *)this;
  (*this->m_tagAliases->_vptr_ITagAliasRegistry[3])(&local_38,this->m_tagAliases,arg);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_arg,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_escapeChars);
  sVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          size(&this->m_arg);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&this->m_substring,sVar3);
  sVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          size(&this->m_arg);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&this->m_patternName,sVar3);
  this->m_realPatternPos = 0;
  this->m_pos = 0;
  do {
    uVar1 = this->m_pos;
    sVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(&this->m_arg);
    if (sVar3 <= uVar1) {
LAB_0011e360:
      endMode(this);
      return this;
    }
    pvVar4 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
             ::operator[](&this->m_arg,this->m_pos);
    bVar2 = visitChar(this,*pvVar4);
    if (!bVar2) {
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->m_testSpec).m_invalidArgs,local_18);
      goto LAB_0011e360;
    }
    this->m_pos = this->m_pos + 1;
  } while( true );
}

Assistant:

TestSpecParser& TestSpecParser::parse( std::string const& arg ) {
        m_mode = None;
        m_exclusion = false;
        m_arg = m_tagAliases->expandAliases( arg );
        m_escapeChars.clear();
        m_substring.reserve(m_arg.size());
        m_patternName.reserve(m_arg.size());
        m_realPatternPos = 0;

        for( m_pos = 0; m_pos < m_arg.size(); ++m_pos )
          //if visitChar fails
           if( !visitChar( m_arg[m_pos] ) ){
               m_testSpec.m_invalidArgs.push_back(arg);
               break;
           }
        endMode();
        return *this;
    }